

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx.c
# Opt level: O1

int ps_set_align_text(ps_decoder_t *ps,char *text)

{
  logmath_t *lmath;
  fsg_model_t *pfVar1;
  uint uVar2;
  s3wid_t sVar3;
  int wid;
  char *pcVar4;
  int iVar5;
  double dVar6;
  char delimfound;
  char *word;
  char local_49;
  char *local_48;
  char *local_40;
  fsg_model_t *local_38;
  
  pcVar4 = __ckd_salloc__(text,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/pocketsphinx.c"
                          ,0x2ac);
  pcVar4 = string_trim(pcVar4,STRING_BOTH);
  iVar5 = 0;
  local_40 = pcVar4;
  while (uVar2 = nextword(pcVar4," \t\n\r",&local_48,&local_49), -1 < (int)uVar2) {
    sVar3 = dict_wordid(ps->dict,local_48);
    if (sVar3 == -1) {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/pocketsphinx.c"
              ,0x2b7,"Unknown word %s\n");
      ckd_free(local_40);
      goto LAB_0010a1ca;
    }
    pcVar4 = local_48 + uVar2;
    local_48[uVar2] = local_49;
    iVar5 = iVar5 + 1;
  }
  lmath = ps->lmath;
  dVar6 = ps_config_float(ps->config,"lw");
  local_38 = fsg_model_init("_align",lmath,(float32)(float)dVar6,iVar5 + 1);
  pcVar4 = local_40;
  iVar5 = 0;
  do {
    uVar2 = nextword(pcVar4," \t\n\r",&local_48,&local_49);
    if ((int)uVar2 < 0) {
      ckd_free(local_40);
      pfVar1 = local_38;
      local_38->start_state = 0;
      local_38->final_state = iVar5;
      iVar5 = ps_add_fsg(ps,"_align",local_38);
      fsg_model_free(pfVar1);
      if (iVar5 < 0) {
LAB_0010a1ca:
        iVar5 = -1;
      }
      else {
        iVar5 = ps_activate_search(ps,"_align");
      }
      return iVar5;
    }
    sVar3 = dict_wordid(ps->dict,local_48);
    pfVar1 = local_38;
    if (sVar3 == -1) {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/pocketsphinx.c"
              ,0x2c8,"Unknown word %s\n");
      ckd_free(local_40);
      goto LAB_0010a1ca;
    }
    wid = fsg_model_word_add(local_38,local_48);
    fsg_model_trans_add(pfVar1,iVar5,iVar5 + 1,0,wid);
    pcVar4 = local_48 + uVar2;
    local_48[uVar2] = local_49;
    iVar5 = iVar5 + 1;
  } while( true );
}

Assistant:

int
ps_set_align_text(ps_decoder_t *ps, const char *text)
{
    fsg_model_t *fsg;
    char *textbuf = ckd_salloc(text);
    char *ptr, *word, delimfound;
    int n, nwords;

    textbuf = string_trim(textbuf, STRING_BOTH);
    /* First pass: count and verify words */
    nwords = 0;
    ptr = textbuf;
    while ((n = nextword(ptr, " \t\n\r", &word, &delimfound)) >= 0) {
        int wid;
        if ((wid = dict_wordid(ps->dict, word)) == BAD_S3WID) {
            E_ERROR("Unknown word %s\n", word);
            ckd_free(textbuf);
            return -1;
        }
        ptr = word + n;
        *ptr = delimfound;
        ++nwords;
    }
    /* Second pass: make fsg */
    fsg = fsg_model_init("_align", ps->lmath,
                         ps_config_float(ps->config, "lw"),
                         nwords + 1);
    nwords = 0;
    ptr = textbuf;
    while ((n = nextword(ptr, " \t\n\r", &word, &delimfound)) >= 0) {
        int wid;
        if ((wid = dict_wordid(ps->dict, word)) == BAD_S3WID) {
            E_ERROR("Unknown word %s\n", word);
            ckd_free(textbuf);
            return -1;
        }
        wid = fsg_model_word_add(fsg, word);
        fsg_model_trans_add(fsg, nwords, nwords + 1, 0, wid);
        ptr = word + n;
        *ptr = delimfound;
        ++nwords;
    }
    ckd_free(textbuf);
    fsg->start_state = 0;
    fsg->final_state = nwords;
    if (ps_add_fsg(ps, PS_DEFAULT_ALIGN_SEARCH, fsg) < 0) {
        fsg_model_free(fsg);
        return -1;
    }
    fsg_model_free(fsg);
    return ps_activate_search(ps, PS_DEFAULT_ALIGN_SEARCH);
}